

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3_result_error(sqlite3_context *pCtx,char *z,int n)

{
  long in_RDI;
  _func_void_void_ptr *in_stack_00000018;
  u8 in_stack_00000027;
  i64 in_stack_00000028;
  char *in_stack_00000030;
  Mem *in_stack_00000038;
  
  *(undefined4 *)(in_RDI + 0x24) = 1;
  sqlite3VdbeMemSetStr
            (in_stack_00000038,in_stack_00000030,in_stack_00000028,in_stack_00000027,
             in_stack_00000018);
  return;
}

Assistant:

SQLITE_API void sqlite3_result_error(sqlite3_context *pCtx, const char *z, int n){
#ifdef SQLITE_ENABLE_API_ARMOR
  if( pCtx==0 ) return;
#endif
  assert( sqlite3_mutex_held(pCtx->pOut->db->mutex) );
  pCtx->isError = SQLITE_ERROR;
  sqlite3VdbeMemSetStr(pCtx->pOut, z, n, SQLITE_UTF8, SQLITE_TRANSIENT);
}